

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixMapfile(unixFile *pFd,i64 nMap)

{
  int iVar1;
  undefined1 local_b0 [8];
  stat statbuf;
  i64 nMap_local;
  unixFile *pFd_local;
  
  if (pFd->nFetchOut < 1) {
    statbuf.__glibc_reserved[2] = nMap;
    if (nMap < 0) {
      iVar1 = (*aSyscall[5].pCurrent)((ulong)(uint)pFd->h,local_b0);
      if (iVar1 != 0) {
        return 0x70a;
      }
      statbuf.__glibc_reserved[2] = statbuf.st_rdev;
    }
    if (pFd->mmapSizeMax < statbuf.__glibc_reserved[2]) {
      statbuf.__glibc_reserved[2] = pFd->mmapSizeMax;
    }
    if (statbuf.__glibc_reserved[2] != pFd->mmapSize) {
      unixRemapfile(pFd,statbuf.__glibc_reserved[2]);
    }
  }
  return 0;
}

Assistant:

static int unixMapfile(unixFile *pFd, i64 nMap){
  assert( nMap>=0 || pFd->nFetchOut==0 );
  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( pFd->nFetchOut>0 ) return SQLITE_OK;

  if( nMap<0 ){
    struct stat statbuf;          /* Low-level file information */
    if( osFstat(pFd->h, &statbuf) ){
      return SQLITE_IOERR_FSTAT;
    }
    nMap = statbuf.st_size;
  }
  if( nMap>pFd->mmapSizeMax ){
    nMap = pFd->mmapSizeMax;
  }

  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( nMap!=pFd->mmapSize ){
    unixRemapfile(pFd, nMap);
  }

  return SQLITE_OK;
}